

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O0

LPVOID VIRTUALCommitMemory(CPalThread *pthrCurrent,LPVOID lpAddress,SIZE_T dwSize,
                          DWORD flAllocationType,DWORD flProtect)

{
  bool bVar1;
  byte bVar2;
  INT __prot;
  uint __c;
  int iVar3;
  BOOL BVar4;
  LPVOID pvVar5;
  ulong uVar6;
  ulong Index;
  void *__addr;
  undefined1 *puVar7;
  int *piVar8;
  void *pRet;
  LPVOID pReservedMemory;
  INT vProtect;
  INT nProtect;
  SIZE_T index;
  SIZE_T runLength;
  SIZE_T runStart;
  SIZE_T initialRunStart;
  INT curProtectionState;
  INT protectionState;
  INT curAllocationType;
  INT allocationType;
  SIZE_T totalPages;
  LPVOID pvStack_48;
  BOOL IsLocallyReserved;
  LPVOID pRetVal;
  PCMI pInformation;
  SIZE_T MemSize;
  UINT_PTR StartBoundary;
  DWORD flProtect_local;
  DWORD flAllocationType_local;
  SIZE_T dwSize_local;
  LPVOID lpAddress_local;
  CPalThread *pthrCurrent_local;
  
  MemSize = 0;
  bVar1 = false;
  if (lpAddress == (LPVOID)0x0) {
    pInformation = (PCMI)(dwSize + 0xfff & 0xfffffffffffff000);
  }
  else {
    MemSize = (ulong)lpAddress & 0xfffffffffffff000;
    pInformation = (PCMI)(((long)lpAddress + dwSize + 0xfff & 0xfffffffffffff000) - MemSize);
  }
  pRetVal = VIRTUALFindRegionInformation(MemSize);
  if ((PCMI)pRetVal == (PCMI)0x0) {
    pvVar5 = VIRTUALReserveMemory(pthrCurrent,lpAddress,dwSize,flAllocationType,flProtect);
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    if (pvVar5 == (LPVOID)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
        return (LPVOID)0x0;
      }
      abort();
    }
    MemSize = (ulong)pvVar5 & 0xfffffffffffff000;
    pInformation = (PCMI)(((long)pvVar5 + dwSize + 0xfff & 0xfffffffffffff000) - MemSize);
    pRetVal = VIRTUALFindRegionInformation(MemSize);
    if ((PCMI)pRetVal == (PCMI)0x0) {
      fprintf(_stderr,"] %s %s:%d","VIRTUALCommitMemory",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
              ,0x4af);
      fprintf(_stderr,"Unable to locate the region information.\n");
      CorUnix::CPalThread::SetLastError(0x54f);
      return (LPVOID)0x0;
    }
    bVar1 = true;
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  uVar6 = (ulong)pInformation >> 0xc;
  Index = MemSize - *(long *)((long)pRetVal + 0x10) >> 0xc;
  protectionState = VIRTUALGetAllocationType(Index,(PCMI)pRetVal);
  initialRunStart._4_4_ = (uint)*(byte *)(*(long *)((long)pRetVal + 0x30) + Index);
  __prot = W32toUnixAccessControl(flProtect);
  bVar2 = VIRTUALConvertWinFlags(flProtect);
  __c = (uint)bVar2;
  runLength = Index;
  if ((*(ulong *)((long)pRetVal + 0x18) >> 0xc) - Index < uVar6) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
LAB_003aa655:
    if (((flAllocationType & 0x2000) != 0) || (bVar1)) {
      munmap((void *)0x0,(size_t)pInformation);
      BVar4 = VIRTUALReleaseMemory((PCMI)pRetVal);
      if (BVar4 == 0) {
        fprintf(_stderr,"] %s %s:%d","VIRTUALCommitMemory",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
                ,0x544);
        fprintf(_stderr,"Unable to remove the PCMI entry from the list.\n");
        CorUnix::CPalThread::SetLastError(0x54f);
        return (LPVOID)0x0;
      }
    }
    pvStack_48 = (LPVOID)0x0;
  }
  else {
    while (index = 1, initialRunStart._0_4_ = initialRunStart._4_4_,
          curProtectionState = protectionState, _vProtect = runLength, runLength < Index + uVar6) {
      while (_vProtect = _vProtect + 1, _vProtect < Index + uVar6) {
        curProtectionState = VIRTUALGetAllocationType(_vProtect,(PCMI)pRetVal);
        initialRunStart._0_4_ = (uint)*(byte *)(*(long *)((long)pRetVal + 0x30) + _vProtect);
        if ((curProtectionState != protectionState) ||
           ((uint)initialRunStart != initialRunStart._4_4_)) break;
        index = index + 1;
      }
      __addr = (void *)(*(long *)((long)pRetVal + 0x10) + runLength * 0x1000);
      pInformation = (PCMI)(index << 0xc);
      if (protectionState != 0x1000) {
        puVar7 = (undefined1 *)mmap64(__addr,(size_t)pInformation,3,0x32,-1,0);
        if (puVar7 == &DAT_ffffffffffffffff) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          piVar8 = __errno_location();
          strerror(*piVar8);
          goto LAB_003aa655;
        }
        VIRTUALSetAllocState(0x1000,runLength,index,(PCMI)pRetVal);
        if (__prot == 3) {
          memset((void *)(*(long *)((long)pRetVal + 0x30) + runLength),__c,index);
        }
        initialRunStart._4_4_ = 2;
      }
      if (initialRunStart._4_4_ != __c) {
        iVar3 = mprotect(__addr,(size_t)pInformation,__prot);
        if (iVar3 == -1) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          piVar8 = __errno_location();
          strerror(*piVar8);
          goto LAB_003aa655;
        }
        memset((void *)(*(long *)((long)pRetVal + 0x30) + runLength),__c,index);
      }
      protectionState = curProtectionState;
      initialRunStart._4_4_ = (uint)initialRunStart;
      runLength = _vProtect;
    }
    pvStack_48 = (LPVOID)(*(long *)((long)pRetVal + 0x10) + Index * 0x1000);
  }
  return pvStack_48;
}

Assistant:

static LPVOID VIRTUALCommitMemory(
                IN CPalThread *pthrCurrent, /* Currently executing thread */
                IN LPVOID lpAddress,        /* Region to reserve or commit */
                IN SIZE_T dwSize,           /* Size of Region */
                IN DWORD flAllocationType,  /* Type of allocation */
                IN DWORD flProtect)         /* Type of access protection */
{
    UINT_PTR StartBoundary      = 0;
    SIZE_T MemSize              = 0;
    PCMI pInformation           = 0;
    LPVOID pRetVal              = NULL;
    BOOL IsLocallyReserved      = FALSE;
    SIZE_T totalPages;
    INT allocationType, curAllocationType;
    INT protectionState, curProtectionState;
    SIZE_T initialRunStart;
    SIZE_T runStart;
    SIZE_T runLength;
    SIZE_T index;
    INT nProtect;
    INT vProtect;

    if ( lpAddress )
    {
        StartBoundary = (UINT_PTR)lpAddress & ~VIRTUAL_PAGE_MASK;
        /* Add the sizes, and round down to the nearest page boundary. */
        MemSize = ( ((UINT_PTR)lpAddress + dwSize + VIRTUAL_PAGE_MASK) & ~VIRTUAL_PAGE_MASK ) -
                  StartBoundary;
    }
    else
    {
        MemSize = ( dwSize + VIRTUAL_PAGE_MASK ) & ~VIRTUAL_PAGE_MASK;
    }

    /* See if we have already reserved this memory. */
    pInformation = VIRTUALFindRegionInformation( StartBoundary );

    if ( !pInformation )
    {
        /* According to the new MSDN docs, if MEM_COMMIT is specified,
        and the memory is not reserved, you reserve and then commit.
        */
        LPVOID pReservedMemory =
                VIRTUALReserveMemory( pthrCurrent, lpAddress, dwSize,
                                      flAllocationType, flProtect );

        TRACE( "Reserve and commit the memory!\n " );

        if ( pReservedMemory )
        {
            /* Re-align the addresses and try again to find the memory. */
            StartBoundary = (UINT_PTR)pReservedMemory & ~VIRTUAL_PAGE_MASK;
            MemSize = ( ((UINT_PTR)pReservedMemory + dwSize + VIRTUAL_PAGE_MASK)
                        & ~VIRTUAL_PAGE_MASK ) - StartBoundary;

            pInformation = VIRTUALFindRegionInformation( StartBoundary );

            if ( !pInformation )
            {
                ASSERT( "Unable to locate the region information.\n" );
                pthrCurrent->SetLastError( ERROR_INTERNAL_ERROR );
                pRetVal = NULL;
                goto done;
            }
            IsLocallyReserved = TRUE;
        }
        else
        {
            ERROR( "Unable to reserve the memory.\n" );
            /* Don't set last error here, it will already be set. */
            pRetVal = NULL;
            goto done;
        }
    }

    TRACE( "Committing the memory now..\n");

    // Pages that aren't already committed need to be committed. Pages that
    // are committed don't need to be committed, but they might need to have
    // their permissions changed.
    // To get this right, we find runs of pages with similar states and
    // permissions. If a run is not committed, we commit it and then set
    // its permissions. If a run is committed but has different permissions
    // from what we're trying to set, we set its permissions. Finally,
    // if a run is already committed and has the right permissions,
    // we don't need to do anything to it.

    totalPages = MemSize / VIRTUAL_PAGE_SIZE;
    runStart = (StartBoundary - pInformation->startBoundary) /
                VIRTUAL_PAGE_SIZE;   // Page index
    initialRunStart = runStart;
    allocationType = VIRTUALGetAllocationType(runStart, pInformation);
    protectionState = pInformation->pProtectionState[runStart];
    curAllocationType = allocationType;
    curProtectionState = protectionState;
    runLength = 1;
    nProtect = W32toUnixAccessControl(flProtect);
    vProtect = VIRTUALConvertWinFlags(flProtect);

    if (totalPages > pInformation->memSize / VIRTUAL_PAGE_SIZE - runStart)
    {
        ERROR("Trying to commit beyond the end of the region!\n");
        goto error;
    }

    while(runStart < initialRunStart + totalPages)
    {
        // Find the next run of pages
        for(index = runStart + 1; index < initialRunStart + totalPages;
            index++)
        {
            curAllocationType = VIRTUALGetAllocationType(index, pInformation);
            curProtectionState = pInformation->pProtectionState[index];
            if (curAllocationType != allocationType ||
                curProtectionState != protectionState)
            {
                break;
            }
            runLength++;
        }

        StartBoundary = pInformation->startBoundary + runStart * VIRTUAL_PAGE_SIZE;
        MemSize = runLength * VIRTUAL_PAGE_SIZE;
        if (allocationType != MEM_COMMIT)
        {
            // Commit the pages
            void * pRet = MAP_FAILED;
#if MMAP_DOESNOT_ALLOW_REMAP
            if (mprotect((void *) StartBoundary, MemSize, PROT_WRITE | PROT_READ) == 0)
                pRet = (void *)StartBoundary;
#else // MMAP_DOESNOT_ALLOW_REMAP
            pRet = mmap((void *) StartBoundary, MemSize, PROT_WRITE | PROT_READ,
                     MAP_ANON | MAP_FIXED | MAP_PRIVATE, -1, 0);
#endif // MMAP_DOESNOT_ALLOW_REMAP
            if (pRet != MAP_FAILED)
            {
#if MMAP_DOESNOT_ALLOW_REMAP
                SIZE_T i;
                char *temp = (char *) StartBoundary;
                for(i = 0; i < runLength; i++)
                {

                    if (VIRTUALIsPageDirty(runStart + i, pInformation))
                    {
                        // This page is being recommitted after being decommitted,
                        // therefore the memory needs to be cleared
                        memset (temp, 0, VIRTUAL_PAGE_SIZE);
                    }

                    temp += VIRTUAL_PAGE_SIZE;
                }
#endif // MMAP_DOESNOT_ALLOW_REMAP
            }
            else
            {
                ERROR("mmap() failed! Error(%d)=%s\n", errno, strerror(errno));
                goto error;
            }
            VIRTUALSetAllocState(MEM_COMMIT, runStart, runLength, pInformation);
#if MMAP_DOESNOT_ALLOW_REMAP
            VIRTUALSetDirtyPages (0, runStart, runLength, pInformation);
#endif // MMAP_DOESNOT_ALLOW_REMAP

            if (nProtect == (PROT_WRITE | PROT_READ))
            {
                // Handle this case specially so we don't bother
                // mprotect'ing the region.
                memset(pInformation->pProtectionState + runStart,
                       vProtect, runLength);
            }
            protectionState = VIRTUAL_READWRITE;
        }
        if (protectionState != vProtect)
        {
            // Change permissions.
            if (mprotect((void *) StartBoundary, MemSize, nProtect) != -1)
            {
                memset(pInformation->pProtectionState + runStart,
                       vProtect, runLength);
            }
            else
            {
                ERROR("mprotect() failed! Error(%d)=%s\n",
                      errno, strerror(errno));
                goto error;
            }
        }

        runStart = index;
        runLength = 1;
        allocationType = curAllocationType;
        protectionState = curProtectionState;
    }
    pRetVal = (void *) (pInformation->startBoundary +
                        initialRunStart * VIRTUAL_PAGE_SIZE);
    goto done;

error:
    if ( flAllocationType & MEM_RESERVE || IsLocallyReserved )
    {
#if (MMAP_IGNORES_HINT && !MMAP_DOESNOT_ALLOW_REMAP)
        mmap(pRetVal, MemSize, PROT_NONE, MAP_FIXED | MAP_PRIVATE,
             gBackingFile, (char *) pRetVal - (char *) gBackingBaseAddress);
#else   // MMAP_IGNORES_HINT && !MMAP_DOESNOT_ALLOW_REMAP
        munmap( pRetVal, MemSize );
#endif  // MMAP_IGNORES_HINT && !MMAP_DOESNOT_ALLOW_REMAP
        if ( VIRTUALReleaseMemory( pInformation ) == FALSE )
        {
            ASSERT( "Unable to remove the PCMI entry from the list.\n" );
            pthrCurrent->SetLastError( ERROR_INTERNAL_ERROR );
            pRetVal = NULL;
            goto done;
        }
        pInformation = NULL;
        pRetVal = NULL;
    }

done:

    return pRetVal;
}